

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::TranslateWindowsInViewport(ImGuiViewportP *viewport,ImVec2 *old_pos,ImVec2 *new_pos)

{
  ImGuiWindow **ppIVar1;
  bool bVar2;
  bool local_72;
  bool local_71;
  ImRect local_60;
  int local_50;
  ImVec2 IStack_4c;
  int window_n;
  ImVec2 delta_pos;
  undefined1 local_3c [8];
  ImRect test_still_fit_rect;
  bool translate_all_windows;
  ImGuiContext *g;
  ImVec2 *new_pos_local;
  ImVec2 *old_pos_local;
  ImGuiViewportP *viewport_local;
  
  stack0xffffffffffffffd8 = GImGui;
  bVar2 = false;
  if (viewport->Window == (ImGuiWindow *)0x0) {
    bVar2 = ((viewport->super_ImGuiViewport).Flags & 0x1000U) != 0;
  }
  if (bVar2) {
    test_still_fit_rect.Max.x._3_1_ =
         (GImGui->ConfigFlagsCurrFrame & 0x400U) != (GImGui->ConfigFlagsLastFrame & 0x400U);
    delta_pos = operator+(old_pos,&(viewport->super_ImGuiViewport).Size);
    ImRect::ImRect((ImRect *)local_3c,old_pos,&delta_pos);
    IStack_4c = operator-(new_pos,old_pos);
    for (local_50 = 0; local_50 < (stack0xffffffffffffffd8->Windows).Size; local_50 = local_50 + 1)
    {
      local_71 = true;
      if ((test_still_fit_rect.Max.x._3_1_ & 1) == 0) {
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&stack0xffffffffffffffd8->Windows,local_50);
        local_72 = false;
        if ((*ppIVar1)->Viewport == viewport) {
          ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&stack0xffffffffffffffd8->Windows,local_50);
          local_60 = ImGuiWindow::Rect(*ppIVar1);
          local_72 = ImRect::Contains((ImRect *)local_3c,&local_60);
        }
        local_71 = local_72;
      }
      if (local_71 != false) {
        ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&stack0xffffffffffffffd8->Windows,local_50);
        TranslateWindow(*ppIVar1,&stack0xffffffffffffffb4);
      }
    }
    return;
  }
  __assert_fail("viewport->Window == __null && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x2e11,
                "void ImGui::TranslateWindowsInViewport(ImGuiViewportP *, const ImVec2 &, const ImVec2 &)"
               );
}

Assistant:

void ImGui::TranslateWindowsInViewport(ImGuiViewportP* viewport, const ImVec2& old_pos, const ImVec2& new_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(viewport->Window == NULL && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows));

    // 1) We test if ImGuiConfigFlags_ViewportsEnable was just toggled, which allows us to conveniently
    // translate imgui windows from OS-window-local to absolute coordinates or vice-versa.
    // 2) If it's not going to fit into the new size, keep it at same absolute position.
    // One problem with this is that most Win32 applications doesn't update their render while dragging,
    // and so the window will appear to teleport when releasing the mouse.
    const bool translate_all_windows = (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable) != (g.ConfigFlagsLastFrame & ImGuiConfigFlags_ViewportsEnable);
    ImRect test_still_fit_rect(old_pos, old_pos + viewport->Size);
    ImVec2 delta_pos = new_pos - old_pos;
    for (int window_n = 0; window_n < g.Windows.Size; window_n++) // FIXME-OPT
        if (translate_all_windows || (g.Windows[window_n]->Viewport == viewport && test_still_fit_rect.Contains(g.Windows[window_n]->Rect())))
            TranslateWindow(g.Windows[window_n], delta_pos);
}